

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_get_session(mbedtls_ssl_context *ssl,mbedtls_ssl_session *dst)

{
  mbedtls_ssl_session *dst_local;
  mbedtls_ssl_context *ssl_local;
  
  if ((((ssl == (mbedtls_ssl_context *)0x0) || (dst == (mbedtls_ssl_session *)0x0)) ||
      (ssl->session == (mbedtls_ssl_session *)0x0)) || ((*(uint *)&ssl->conf->field_0x164 & 1) != 0)
     ) {
    ssl_local._4_4_ = -0x7100;
  }
  else {
    ssl_local._4_4_ = ssl_session_copy(dst,ssl->session);
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_get_session( const mbedtls_ssl_context *ssl, mbedtls_ssl_session *dst )
{
    if( ssl == NULL ||
        dst == NULL ||
        ssl->session == NULL ||
        ssl->conf->endpoint != MBEDTLS_SSL_IS_CLIENT )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    return( ssl_session_copy( dst, ssl->session ) );
}